

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageQueue.h
# Opt level: O0

void __thiscall
SortedList<MessageQueue::ListEntry>::InsertAfter
          (SortedList<MessageQueue::ListEntry> *this,DListNode<MessageQueue::ListEntry> *newNode,
          DListNode<MessageQueue::ListEntry> *node)

{
  PAL_FILE *pPVar1;
  DListNode<MessageQueue::ListEntry> *node_local;
  DListNode<MessageQueue::ListEntry> *newNode_local;
  SortedList<MessageQueue::ListEntry> *this_local;
  
  if (this->head == (DListNode<MessageQueue::ListEntry> *)0x0) {
    if (node != (DListNode<MessageQueue::ListEntry> *)0x0) {
      pPVar1 = PAL_get_stderr(0);
      PAL_fprintf(pPVar1,"ASSERTION (%s, line %d) %s %s\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/bin/ch/MessageQueue.h"
                  ,0x92,"node == nullptr");
      pPVar1 = PAL_get_stderr(0);
      PAL_fflush(pPVar1);
      DebugBreak();
    }
    this->head = newNode;
  }
  else if (node == (DListNode<MessageQueue::ListEntry> *)0x0) {
    newNode->next = this->head;
    this->head->prev = newNode;
    this->head = newNode;
  }
  else {
    if (node == (DListNode<MessageQueue::ListEntry> *)0x0) {
      pPVar1 = PAL_get_stderr(0);
      PAL_fprintf(pPVar1,"ASSERTION (%s, line %d) %s %s\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/bin/ch/MessageQueue.h"
                  ,0xa0,"node");
      pPVar1 = PAL_get_stderr(0);
      PAL_fflush(pPVar1);
      DebugBreak();
    }
    newNode->next = node->next;
    newNode->prev = node;
    if (node->next != (DListNode<MessageQueue::ListEntry> *)0x0) {
      node->next->prev = newNode;
    }
    node->next = newNode;
  }
  return;
}

Assistant:

void InsertAfter(DListNode<T>* newNode, DListNode<T>* node)
    {
        // If the list is empty, just set head to newNode
        if (head == nullptr)
        {
            Assert(node == nullptr);
            head = newNode;
            return;
        }

        // If node is null here, we must be trying to insert before head
        if (node == nullptr)
        {
            newNode->next = head;
            head->prev = newNode;
            head = newNode;
            return;
        }

        Assert(node);
        newNode->next = node->next;
        newNode->prev = node;

        if (node->next)
        {
            node->next->prev = newNode;
        }

        node->next = newNode;
    }